

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int decode_client_hello(ptls_context_t *ctx,st_ptls_client_hello_t *ch,uint8_t *src,uint8_t *end,
                       ptls_handshake_properties_t *properties,ptls_t *tls_cbarg)

{
  uint *puVar1;
  ptls_client_hello_psk_identity_t *ppVar2;
  long lVar3;
  byte *pbVar4;
  byte bVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  uint8_t uVar8;
  st_ptls_on_extension_t *psVar9;
  undefined1 auVar10 [32];
  ushort uVar11;
  int iVar12;
  uint8_t *puVar13;
  uint8_t *puVar14;
  byte *pbVar15;
  void *pvVar16;
  ptls_raw_extension_t *ppVar17;
  ulong uVar18;
  ulong uVar19;
  ushort *puVar20;
  undefined1 *puVar21;
  undefined1 *puVar22;
  size_t *psVar23;
  long lVar24;
  long lVar25;
  ptls_raw_extension_t *ppVar26;
  long lVar27;
  ptls_raw_extension_t *ppVar28;
  uint uVar29;
  ptls_raw_extension_t *ppVar30;
  bool bVar31;
  ptls_iovec_t pVar32;
  ptls_raw_extension_t *local_b8;
  ptls_raw_extension_t *local_b0;
  ptls_raw_extension_t *local_a8;
  ptls_raw_extension_t *local_a0;
  ptls_t *local_98;
  ptls_raw_extension_t *local_90;
  size_t *local_88;
  ptls_raw_extension_t *local_80;
  st_ptls_signature_algorithms_t *local_78;
  anon_struct_264_2_e44304f5_for_alpn *local_70;
  anon_struct_168_2_32182ca3_for_identities *local_68;
  st_ptls_extension_bitmap_t bitmap;
  undefined1 local_58 [32];
  size_t local_38;
  
  iVar12 = 0x32;
  if (1 < (long)end - (long)src) {
    uVar11 = *(ushort *)src << 8 | *(ushort *)src >> 8;
    ch->legacy_version = uVar11;
    if (uVar11 < 0x301) {
      iVar12 = 0x46;
    }
    else if ((0x1f < (long)end - (long)(src + 2)) && (ch->random_bytes = src + 2, src + 0x22 != end)
            ) {
      puVar13 = src + 0x23;
      uVar18 = (ulong)src[0x22];
      if (uVar18 <= (ulong)((long)end - (long)puVar13) && uVar18 < 0x21) {
        (ch->legacy_session_id).base = puVar13;
        puVar13 = puVar13 + uVar18;
        (ch->legacy_session_id).len = uVar18;
        if (1 < (ulong)((long)end - (long)puVar13)) {
          puVar14 = puVar13 + 2;
          uVar18 = (ulong)CONCAT11(*puVar13,puVar13[1]);
          if ((puVar13[1] & 1) == 0 && uVar18 <= (ulong)((long)end - (long)puVar14)) {
            (ch->cipher_suites).base = puVar14;
            pbVar15 = puVar14 + uVar18;
            (ch->cipher_suites).len = uVar18;
            if (pbVar15 != end) {
              uVar18 = (ulong)*pbVar15;
              pbVar15 = pbVar15 + 1;
              if (uVar18 <= (ulong)((long)end - (long)pbVar15) && uVar18 != 0) {
                (ch->compression_methods).ids = pbVar15;
                pbVar15 = pbVar15 + uVar18;
                (ch->compression_methods).count = uVar18;
                if (pbVar15 == end) {
LAB_00114e6a:
                  iVar12 = 0;
                }
                else {
                  ch->first_extension_at = (size_t)(pbVar15 + (2 - (long)src));
                  bitmap.bits = 0;
                  if (1 < (ulong)((long)end - (long)pbVar15)) {
                    ppVar17 = (ptls_raw_extension_t *)(pbVar15 + 2);
                    if ((ulong)CONCAT11(*pbVar15,pbVar15[1]) <= (ulong)((long)end - (long)ppVar17))
                    {
                      local_a8 = (ptls_raw_extension_t *)
                                 ((long)&ppVar17->type + (ulong)CONCAT11(*pbVar15,pbVar15[1]));
                      local_68 = &(ch->psk).identities;
                      local_78 = &ch->signature_algorithms;
                      local_70 = &ch->alpn;
                      local_80 = ch->unknown_extensions;
                      local_88 = &(ch->psk).identities.list[0].binder.len;
LAB_001143cc:
                      if (ppVar17 == local_a8) {
                        if (local_a8 != (ptls_raw_extension_t *)end) {
                          return 0x32;
                        }
                        return 0;
                      }
                      if ((long)local_a8 - (long)ppVar17 < 2) {
                        return 0x32;
                      }
                      uVar11 = ppVar17->type << 8 | ppVar17->type >> 8;
                      local_98 = (ptls_t *)(ulong)uVar11;
                      local_b8 = ppVar17;
                      local_b0 = ppVar17;
                      iVar12 = extension_bitmap_testandset(&bitmap,1,uVar11);
                      if (iVar12 == 0) goto LAB_00114e83;
                      if ((ulong)((long)local_a8 - (long)&local_b0->field_0x2) < 2) {
                        return 0x32;
                      }
                      local_b8 = (ptls_raw_extension_t *)&local_b0->field_0x4;
                      uVar11 = CONCAT11(local_b0->field_0x2,local_b0->field_0x3);
                      ppVar30 = (ptls_raw_extension_t *)(ulong)uVar11;
                      if ((ptls_raw_extension_t *)((long)local_a8 - (long)local_b8) < ppVar30) {
                        return 0x32;
                      }
                      puVar22 = &(ch->psk).field_0xb4;
                      *puVar22 = *puVar22 & 0xfd;
                      psVar9 = ctx->on_extension;
                      ppVar26 = local_b8;
                      if ((psVar9 != (st_ptls_on_extension_t *)0x0 && tls_cbarg != (ptls_t *)0x0) &&
                         (pVar32.len._0_2_ = uVar11, pVar32.base = (uint8_t *)local_b8,
                         pVar32.len._2_6_ = 0, local_a0 = ppVar30, local_90 = local_b8,
                         iVar12 = (*psVar9->cb)(psVar9,tls_cbarg,'\x01',(uint16_t)local_98,pVar32),
                         ppVar26 = local_90, ppVar30 = local_a0, iVar12 != 0)) {
                        return 1;
                      }
                      ppVar17 = (ptls_raw_extension_t *)(&local_b0->field_0x4 + (long)ppVar30);
                      iVar12 = (int)local_98;
                      uVar29 = (uint)ppVar30;
                      switch(iVar12) {
                      case 0x29:
                        if (uVar29 < 2) {
                          return 0x32;
                        }
                        local_b8 = (ptls_raw_extension_t *)&local_b0->field_0x6;
                        puVar22 = (undefined1 *)
                                  (ulong)CONCAT11(local_b0->field_0x4,local_b0->field_0x5);
                        if ((undefined1 *)((long)&ppVar30[-1].data.len + 6) < puVar22) {
                          return 0x32;
                        }
                        local_98 = (ptls_t *)(puVar22 + (long)local_b8);
                        lVar25 = 1;
                        local_a0 = ppVar17;
                        do {
                          local_38 = 0;
                          if ((ulong)((long)local_98 - (long)local_b8) < 2) {
                            return 0x32;
                          }
                          uVar19 = (ulong)(byte)local_b8->type * 0x100;
                          puVar22 = &local_b8->field_0x2;
                          uVar18 = (ulong)*(byte *)((long)&local_b8->type + 1);
                          if ((ulong)((long)local_98 - (long)puVar22) <= (uVar19 + uVar18) - 1) {
                            return 0x32;
                          }
                          uVar19 = uVar19 | uVar18;
                          local_b8 = (ptls_raw_extension_t *)(puVar22 + uVar19);
                          local_58._0_16_ = CONCAT88(uVar19,puVar22);
                          local_58 = ZEXT1632(local_58._0_16_);
                          local_b0 = (ptls_raw_extension_t *)lVar25;
                          iVar12 = ptls_decode32((uint32_t *)(local_58 + 0x10),(uint8_t **)&local_b8
                                                 ,(uint8_t *)local_98);
                          auVar10 = local_58;
                          if (iVar12 != 0) {
                            return iVar12;
                          }
                          uVar18 = (ch->psk).identities.count;
                          if (uVar18 < 4) {
                            (ch->psk).identities.count = uVar18 + 1;
                            local_68->list[uVar18].binder.len = local_38;
                            ppVar2 = local_68->list + uVar18;
                            (ppVar2->identity).base = (uint8_t *)local_58._0_8_;
                            (ppVar2->identity).len = local_58._8_8_;
                            ppVar2->obfuscated_ticket_age = local_58._16_4_;
                            *(undefined4 *)&ppVar2->field_0x14 = local_58._20_4_;
                            (ppVar2->binder).base = (uint8_t *)local_58._24_8_;
                          }
                          lVar25 = (long)local_b0 + 1;
                        } while ((ptls_t *)local_b8 != local_98);
                        (ch->psk).hash_end = (uint8_t *)local_b8;
                        if ((ulong)((long)local_a0 - (long)local_98) < 2) {
                          return 0x32;
                        }
                        ppVar17 = (ptls_raw_extension_t *)&local_b8->field_0x2;
                        uVar18 = (ulong)(ushort)(local_b8->type << 8 | local_b8->type >> 8);
                        if ((ulong)((long)local_a0 - (long)ppVar17) < uVar18) {
                          return 0x32;
                        }
                        ppVar30 = (ptls_raw_extension_t *)((long)ppVar17 + uVar18);
                        uVar18 = 0;
                        psVar23 = local_88;
                        do {
                          if (ppVar30 == ppVar17) {
                            return 0x32;
                          }
                          uVar19 = (ulong)(byte)ppVar17->type;
                          pbVar15 = (byte *)((long)&ppVar17->type + 1);
                          if ((ulong)((long)ppVar30 - (long)pbVar15) < uVar19) {
                            return 0x32;
                          }
                          if (uVar18 < (ch->psk).identities.count) {
                            ((ptls_iovec_t *)(psVar23 + -1))->base = pbVar15;
                            *psVar23 = uVar19;
                          }
                          ppVar17 = (ptls_raw_extension_t *)(pbVar15 + uVar19);
                          uVar18 = uVar18 + 1;
                          local_b0 = (ptls_raw_extension_t *)((long)local_b0 + -1);
                          psVar23 = psVar23 + 5;
                        } while (ppVar17 != ppVar30);
                        if (local_b0 == (ptls_raw_extension_t *)0x0) {
                          if (ppVar30 != local_a0) {
                            return 0x32;
                          }
                          puVar22 = &(ch->psk).field_0xb4;
                          *puVar22 = *puVar22 | 2;
                          ppVar17 = local_a0;
                          local_58 = auVar10;
                          goto LAB_001143cc;
                        }
                        break;
                      case 0x2a:
                        puVar22 = &(ch->psk).field_0xb4;
                        *puVar22 = *puVar22 | 1;
                        goto LAB_001143cc;
                      case 0x2b:
                        if (ppVar30 == (ptls_raw_extension_t *)0x0) {
                          return 0x32;
                        }
                        puVar20 = (ushort *)&local_b0->field_0x5;
                        if ((undefined1 *)((long)&ppVar30[-1].data.len + 7) <
                            (undefined1 *)(ulong)(byte)local_b0->field_0x4) {
                          return 0x32;
                        }
                        ppVar30 = (ptls_raw_extension_t *)
                                  ((undefined1 *)(ulong)(byte)local_b0->field_0x4 + (long)puVar20);
                        lVar25 = 1;
                        do {
                          lVar24 = (long)ppVar30 - (long)puVar20;
                          if (lVar24 < 2) {
                            return 0x32;
                          }
                          uVar11 = *puVar20;
                          puVar20 = puVar20 + 1;
                          lVar27 = 1;
                          do {
                            lVar3 = lVar25 + lVar27;
                            lVar27 = lVar27 + -1;
                            if (lVar3 == 1) break;
                          } while ((ushort)(uVar11 << 8 | uVar11 >> 8) != 0x304);
                          lVar25 = -lVar27;
                        } while ((ptls_raw_extension_t *)puVar20 != ppVar30);
                        if (lVar27 != -1) {
                          ch->selected_version = 0x304;
                        }
                        if (1 < lVar24) goto LAB_00114dfe;
                        goto LAB_00114e6a;
                      case 0x2c:
                        if ((properties != (ptls_handshake_properties_t *)0x0) &&
                           ((properties->field_0).server.cookie.key != (void *)0x0)) {
                          (ch->cookie).all.base = (uint8_t *)ppVar26;
                          (ch->cookie).all.len = (size_t)ppVar30;
                          if (ppVar30 < (ptls_raw_extension_t *)0x2) {
                            return 0x32;
                          }
                          puVar22 = &local_b0->field_0x6;
                          puVar21 = (undefined1 *)
                                    (ulong)CONCAT11(local_b0->field_0x4,local_b0->field_0x5);
                          if ((undefined1 *)((long)&ppVar30[-1].data.len + 6) < puVar21) {
                            return 0x32;
                          }
                          (ch->cookie).tbs.base = puVar22;
                          if (puVar21 < (undefined1 *)0x2) {
                            return 0x32;
                          }
                          ppVar30 = (ptls_raw_extension_t *)(puVar21 + (long)puVar22);
                          uVar18 = (ulong)CONCAT11(local_b0->field_0x6,local_b0->field_0x7);
                          if ((ulong)((long)ppVar30 - (long)&local_b0->data) < uVar18) {
                            return 0x32;
                          }
                          if (uVar18 == 0) {
                            return 0x32;
                          }
                          ppVar26 = (ptls_raw_extension_t *)((long)&(local_b0->data).base + uVar18);
                          uVar18 = (ulong)*(byte *)&(local_b0->data).base;
                          puVar13 = (uint8_t *)((long)&(local_b0->data).base + 1);
                          if ((ulong)((long)ppVar26 - (long)puVar13) < uVar18) {
                            return 0x32;
                          }
                          (ch->cookie).ch1_hash.base = puVar13;
                          ppVar28 = (ptls_raw_extension_t *)(puVar13 + uVar18);
                          (ch->cookie).ch1_hash.len = uVar18;
                          if (ppVar28 == ppVar26) {
                            return 0x32;
                          }
                          local_b8 = (ptls_raw_extension_t *)((long)&ppVar28->type + 1);
                          bVar5 = (byte)ppVar28->type;
                          if (bVar5 == 1) {
                            puVar21 = &(ch->cookie).field_0x40;
                            *puVar21 = *puVar21 | 1;
                          }
                          else {
                            if (bVar5 != 0) {
                              return 0x32;
                            }
                            if (((ch->cookie).field_0x40 & 1) != 0) {
                              __assert_fail("!ch->cookie.sent_key_share",
                                            "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                                            ,0xec2,
                                            "int decode_client_hello(ptls_context_t *, struct st_ptls_client_hello_t *, const uint8_t *, const uint8_t *const, ptls_handshake_properties_t *, ptls_t *)"
                                           );
                            }
                          }
                          if (local_b8 != ppVar26) {
                            return 0x32;
                          }
                          (ch->cookie).tbs.len = (long)ppVar26 - (long)puVar22;
                          if (ppVar30 == ppVar26) {
                            return 0x32;
                          }
                          puVar22 = &ppVar28->field_0x2;
                          uVar18 = (ulong)*(byte *)((long)&ppVar28->type + 1);
                          if ((ulong)((long)ppVar30 - (long)puVar22) < uVar18) {
                            return 0x32;
                          }
                          (ch->cookie).signature.base = puVar22;
                          (ch->cookie).signature.len = uVar18;
                          if ((ptls_raw_extension_t *)(puVar22 + uVar18) != ppVar30) {
                            return 0x32;
                          }
                          bVar31 = (ptls_raw_extension_t *)(puVar22 + uVar18) == ppVar17;
                          goto LAB_00114e5a;
                        }
                        break;
                      case 0x2d:
                        if (ppVar30 == (ptls_raw_extension_t *)0x0) {
                          return 0x32;
                        }
                        puVar22 = (undefined1 *)(ulong)(byte)local_b0->field_0x4;
                        if ((undefined1 *)((long)&ppVar30[-1].data.len + 7) < puVar22) {
                          return 0x32;
                        }
                        ppVar30 = (ptls_raw_extension_t *)(&local_b0->field_0x5 + (long)puVar22);
                        ppVar26 = (ptls_raw_extension_t *)&local_b0->field_0x5;
                        do {
                          if (puVar22 == (undefined1 *)0x0) {
                            return 0x32;
                          }
                          ppVar28 = (ptls_raw_extension_t *)((long)&ppVar26->type + 1);
                          bVar5 = (byte)ppVar26->type;
                          if (bVar5 < 0x20) {
                            puVar1 = &(ch->psk).ke_modes;
                            *puVar1 = *puVar1 | 1 << (bVar5 & 0x1f);
                          }
                          puVar22 = puVar22 + -1;
                          ppVar26 = ppVar28;
                        } while (ppVar28 != ppVar30);
LAB_00114c93:
                        bVar31 = ppVar30 == ppVar17;
                        goto LAB_00114e5a;
                      case 0x2e:
                      case 0x2f:
                      case 0x30:
                      case 0x31:
                      case 0x32:
switchD_00114624_caseD_2e:
                        local_90 = ppVar26;
                        if ((tls_cbarg != (ptls_t *)0x0) &&
                           (local_a0 = ppVar17,
                           iVar12 = should_collect_unknown_extension
                                              (tls_cbarg,properties,(uint16_t)local_98),
                           ppVar17 = local_a0, iVar12 != 0)) {
                          iVar12 = collect_unknown_extension
                                             (local_98,(uint16_t)local_90,(uint8_t *)local_a0,
                                              (uint8_t *)local_80,ppVar26);
LAB_00114d67:
                          ppVar17 = local_a0;
                          if (iVar12 != 0) {
                            return iVar12;
                          }
                        }
                        goto LAB_001143cc;
                      case 0x33:
                        (ch->key_shares).base = (uint8_t *)ppVar26;
                        (ch->key_shares).len = (size_t)ppVar30;
                        goto LAB_001143cc;
                      default:
                        if (iVar12 == 0xfe0d) {
                          if (ppVar30 == (ptls_raw_extension_t *)0x0) {
                            return 0x32;
                          }
                          uVar8 = local_b0->field_0x4;
                          (ch->ech).type = uVar8;
                          if (uVar8 == '\x01') {
                            if (uVar29 != 1) {
                              return 0x32;
                            }
                            pbVar15 = (byte *)0x128c9d;
                            uVar18 = 0;
                          }
                          else {
                            if (uVar8 != '\0') break;
                            if (uVar29 < 3) {
                              return 0x32;
                            }
                            (ch->ech).cipher_suite.kdf =
                                 *(ushort *)&local_b0->field_0x5 << 8 |
                                 *(ushort *)&local_b0->field_0x5 >> 8;
                            if (uVar29 < 5) {
                              return 0x32;
                            }
                            (ch->ech).cipher_suite.aead =
                                 *(ushort *)&local_b0->field_0x7 << 8 |
                                 *(ushort *)&local_b0->field_0x7 >> 8;
                            if (uVar29 == 5) {
                              return 0x32;
                            }
                            (ch->ech).config_id = *(uint8_t *)((long)&(local_b0->data).base + 1);
                            if ((uVar29 & 0xfffffffe) == 6) {
                              return 0x32;
                            }
                            uVar11 = *(ushort *)((long)&(local_b0->data).base + 2);
                            puVar22 = (undefined1 *)(ulong)(ushort)(uVar11 << 8 | uVar11 >> 8);
                            if (&ppVar30[-1].data.len < puVar22) {
                              return 0x32;
                            }
                            pbVar4 = (byte *)((long)&local_b0->type + (long)puVar22);
                            (ch->ech).enc.base = (uint8_t *)((long)&(local_b0->data).base + 4);
                            (ch->ech).enc.len = (size_t)puVar22;
                            if ((ulong)((long)ppVar17 - (long)(pbVar4 + 0xc)) < 2) {
                              return 0x32;
                            }
                            uVar18 = (ulong)pbVar4[0xc] * 0x100;
                            pbVar15 = pbVar4 + 0xe;
                            if ((ulong)((long)ppVar17 - (long)pbVar15) <= (uVar18 + pbVar4[0xd]) - 1
                               ) {
                              return 0x32;
                            }
                            uVar18 = uVar18 | pbVar4[0xd];
                          }
                          (ch->ech).payload.base = pbVar15;
                          (ch->ech).payload.len = uVar18;
                          goto LAB_001143cc;
                        }
                        if (iVar12 != 5) {
                          if (iVar12 == 10) {
                            (ch->negotiated_groups).base = (uint8_t *)ppVar26;
                            (ch->negotiated_groups).len = (size_t)ppVar30;
                            goto LAB_001143cc;
                          }
                          if (iVar12 == 0xd) {
                            local_a0 = ppVar17;
                            iVar12 = decode_signature_algorithms
                                               (local_78,(uint8_t **)&local_b8,(uint8_t *)ppVar17);
                            goto LAB_00114d67;
                          }
                          if (iVar12 == 0x10) {
                            if (uVar29 < 2) {
                              return 0x32;
                            }
                            ppVar26 = (ptls_raw_extension_t *)&local_b0->field_0x6;
                            puVar22 = (undefined1 *)
                                      (ulong)CONCAT11(local_b0->field_0x4,local_b0->field_0x5);
                            if ((undefined1 *)((long)&ppVar30[-1].data.len + 6U) < puVar22) {
                              return 0x32;
                            }
                            ppVar30 = (ptls_raw_extension_t *)(puVar22 + (long)ppVar26);
                            do {
                              if (ppVar30 == ppVar26) {
                                return 0x32;
                              }
                              pbVar15 = (byte *)((long)&ppVar26->type + 1);
                              uVar18 = (ulong)(byte)ppVar26->type;
                              if ((ulong)((long)ppVar30 - (long)pbVar15) < uVar18) {
                                return 0x32;
                              }
                              if (uVar18 == 0) {
                                return 0x32;
                              }
                              uVar19 = (ch->alpn).count;
                              if (uVar19 < 0x10) {
                                (ch->alpn).count = uVar19 + 1;
                                local_70->list[uVar19].base = pbVar15;
                                local_70->list[uVar19].len = uVar18;
                              }
                              ppVar26 = (ptls_raw_extension_t *)(pbVar15 + uVar18);
                            } while (ppVar26 != ppVar30);
                          }
                          else {
                            if (iVar12 != 0x14) {
                              if (iVar12 == 0x1b) {
                                if (ppVar30 == (ptls_raw_extension_t *)0x0) {
                                  return 0x32;
                                }
                                puVar22 = &local_b0->field_0x5;
                                puVar21 = (undefined1 *)(ulong)(byte)local_b0->field_0x4;
                                if ((undefined1 *)((long)&ppVar30[-1].data.len + 7U) < puVar21) {
                                  return 0x32;
                                }
                                ppVar30 = (ptls_raw_extension_t *)(puVar22 + (long)puVar21);
                                do {
                                  if ((long)puVar21 < 2) {
                                    return 0x32;
                                  }
                                  uVar6 = *puVar22;
                                  uVar7 = puVar22[1];
                                  puVar22 = puVar22 + 2;
                                  uVar18 = (ch->cert_compression_algos).count;
                                  if (uVar18 < 0x10) {
                                    (ch->cert_compression_algos).count = uVar18 + 1;
                                    (ch->cert_compression_algos).list[uVar18] =
                                         CONCAT11(uVar6,uVar7);
                                  }
                                  puVar21 = puVar21 + -2;
                                } while ((ptls_raw_extension_t *)puVar22 != ppVar30);
                                goto LAB_00114c93;
                              }
                              if (iVar12 != 0x3a) {
                                if (iVar12 == 0) {
                                  if (uVar29 < 2) {
                                    return 0x32;
                                  }
                                  ppVar26 = (ptls_raw_extension_t *)&local_b0->field_0x6;
                                  puVar22 = (undefined1 *)
                                            (ulong)CONCAT11(local_b0->field_0x4,local_b0->field_0x5)
                                  ;
                                  if ((undefined1 *)((long)&ppVar30[-1].data.len + 6U) < puVar22) {
                                    return 0x32;
                                  }
                                  ppVar30 = (ptls_raw_extension_t *)(puVar22 + (long)ppVar26);
                                  local_a0 = ppVar17;
                                  local_90 = ppVar30;
                                  do {
                                    if (ppVar26 == ppVar30) {
                                      return 0x32;
                                    }
                                    if ((ulong)((long)ppVar30 - (long)((long)&ppVar26->type + 1)) <
                                        2) {
                                      return 0x32;
                                    }
                                    local_b0 = (ptls_raw_extension_t *)&ppVar26->field_0x3;
                                    local_98 = (ptls_t *)
                                               (ulong)CONCAT11(*(byte *)((long)&ppVar26->type + 1),
                                                               ppVar26->field_0x2);
                                    if ((ulong)((long)ppVar30 - (long)local_b0) < local_98) {
                                      return 0x32;
                                    }
                                    if ((byte)ppVar26->type == 0) {
                                      local_b8 = local_b0;
                                      pvVar16 = memchr(local_b0,0,(size_t)local_98);
                                      if (pvVar16 != (void *)0x0) goto LAB_00114e83;
                                      (ch->server_name).base = (uint8_t *)local_b0;
                                      (ch->server_name).len = (size_t)local_98;
                                      ppVar30 = local_90;
                                    }
                                    ppVar26 = (ptls_raw_extension_t *)
                                              ((long)local_b0 + (long)local_98);
                                  } while (ppVar26 != ppVar30);
                                  bVar31 = ppVar30 == local_a0;
                                  ppVar17 = local_a0;
                                  goto LAB_00114e5a;
                                }
                                goto switchD_00114624_caseD_2e;
                              }
                              if (uVar29 != 2) {
                                return 0x32;
                              }
                              (ch->ticket_request).new_session_count = local_b0->field_0x4;
                              (ch->ticket_request).resumption_count = local_b0->field_0x5;
                              goto LAB_001143cc;
                            }
                            if (ppVar30 == (ptls_raw_extension_t *)0x0) {
                              return 0x32;
                            }
                            bVar5 = local_b0->field_0x4;
                            puVar22 = (undefined1 *)(ulong)bVar5;
                            if ((undefined1 *)((long)&ppVar30[-1].data.len + 7U) < puVar22) {
                              return 0x32;
                            }
                            if (puVar22 == (undefined1 *)0x1) {
                              bVar5 = local_b0->field_0x5;
                            }
                            if (bVar5 == 0) {
                              return 0x32;
                            }
                            ppVar30 = (ptls_raw_extension_t *)(&local_b0->field_0x5 + (long)puVar22)
                            ;
                            puVar21 = &local_b0->field_0x6;
                            do {
                              uVar18 = (ch->server_certificate_types).count;
                              if (uVar18 < 8) {
                                uVar8 = puVar21[-1];
                                (ch->server_certificate_types).count = uVar18 + 1;
                                (ch->server_certificate_types).list[uVar18] = uVar8;
                              }
                              puVar21 = puVar21 + 1;
                              puVar22 = puVar22 + -1;
                            } while (puVar22 != (undefined1 *)0x0);
                          }
LAB_00114dfe:
                          bVar31 = ppVar30 == ppVar17;
LAB_00114e5a:
                          if (!bVar31) {
                            return 0x32;
                          }
                          goto LAB_001143cc;
                        }
                        ch->field_0x228 = ch->field_0x228 | 1;
                        goto LAB_001143cc;
                      }
LAB_00114e83:
                      iVar12 = 0x2f;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar12;
}

Assistant:

static int decode_client_hello(ptls_context_t *ctx, struct st_ptls_client_hello_t *ch, const uint8_t *src, const uint8_t *const end,
                               ptls_handshake_properties_t *properties, ptls_t *tls_cbarg)
{
    const uint8_t *start = src;
    uint16_t exttype = 0;
    int ret;

    /* decode protocol version (do not bare to decode something older than TLS 1.0) */
    if ((ret = ptls_decode16(&ch->legacy_version, &src, end)) != 0)
        goto Exit;
    if (ch->legacy_version < 0x0301) {
        ret = PTLS_ALERT_PROTOCOL_VERSION;
        goto Exit;
    }

    /* skip random */
    if (end - src < PTLS_HELLO_RANDOM_SIZE) {
        ret = PTLS_ALERT_DECODE_ERROR;
        goto Exit;
    }
    ch->random_bytes = src;
    src += PTLS_HELLO_RANDOM_SIZE;

    /* skip legacy_session_id */
    ptls_decode_open_block(src, end, 1, {
        if (end - src > 32) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->legacy_session_id = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode and select from ciphersuites */
    ptls_decode_open_block(src, end, 2, {
        if ((end - src) % 2 != 0) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->cipher_suites = ptls_iovec_init(src, end - src);
        src = end;
    });

    /* decode legacy_compression_methods */
    ptls_decode_open_block(src, end, 1, {
        if (src == end) {
            ret = PTLS_ALERT_DECODE_ERROR;
            goto Exit;
        }
        ch->compression_methods.ids = src;
        ch->compression_methods.count = end - src;
        src = end;
    });

    /* In TLS versions 1.2 and earlier CH might not have an extensions block (or they might, see what OpenSSL 1.0.0 sends); so bail
     * out if that is the case after parsing the main variables. Zero is returned as it is a valid ClientHello. However
     * `ptls_t::selected_version` remains zero indicating that no compatible version were found. */
    if (src == end) {
        ret = 0;
        goto Exit;
    }

    /* decode extensions */
    ch->first_extension_at = src - start + 2;
    decode_extensions(src, end, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, &exttype, {
        ch->psk.is_last_extension = 0;
        if (ctx->on_extension != NULL && tls_cbarg != NULL &&
            (ret = ctx->on_extension->cb(ctx->on_extension, tls_cbarg, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, exttype,
                                         ptls_iovec_init(src, end - src)) != 0))
            goto Exit;
        switch (exttype) {
        case PTLS_EXTENSION_TYPE_SERVER_NAME:
            if ((ret = client_hello_decode_server_name(&ch->server_name, &src, end)) != 0)
                goto Exit;
            if (src != end) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            break;
        case PTLS_EXTENSION_TYPE_ALPN:
            ptls_decode_block(src, end, 2, {
                do {
                    ptls_decode_open_block(src, end, 1, {
                        /* rfc7301 3.1: empty strings MUST NOT be included */
                        if (src == end) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        if (ch->alpn.count < PTLS_ELEMENTSOF(ch->alpn.list))
                            ch->alpn.list[ch->alpn.count++] = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE:
            ptls_decode_block(src, end, 1, {
                size_t list_size = end - src;

                /* RFC7250 4.1: No empty list, no list with single x509 element */
                if (list_size == 0 || (list_size == 1 && *src == PTLS_CERTIFICATE_TYPE_X509)) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }

                do {
                    if (ch->server_certificate_types.count < PTLS_ELEMENTSOF(ch->server_certificate_types.list))
                        ch->server_certificate_types.list[ch->server_certificate_types.count++] = *src;
                    src++;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE:
            ptls_decode_block(src, end, 1, {
                do {
                    uint16_t id;
                    if ((ret = ptls_decode16(&id, &src, end)) != 0)
                        goto Exit;
                    if (ch->cert_compression_algos.count < PTLS_ELEMENTSOF(ch->cert_compression_algos.list))
                        ch->cert_compression_algos.list[ch->cert_compression_algos.count++] = id;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS:
            ch->negotiated_groups = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS:
            if ((ret = decode_signature_algorithms(&ch->signature_algorithms, &src, end)) != 0)
                goto Exit;
            break;
        case PTLS_EXTENSION_TYPE_KEY_SHARE:
            ch->key_shares = ptls_iovec_init(src, end - src);
            break;
        case PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS:
            ptls_decode_block(src, end, 1, {
                size_t selected_index = PTLS_ELEMENTSOF(supported_versions);
                do {
                    size_t i;
                    uint16_t v;
                    if ((ret = ptls_decode16(&v, &src, end)) != 0)
                        goto Exit;
                    for (i = 0; i != selected_index; ++i) {
                        if (supported_versions[i] == v) {
                            selected_index = i;
                            break;
                        }
                    }
                } while (src != end);
                if (selected_index != PTLS_ELEMENTSOF(supported_versions))
                    ch->selected_version = supported_versions[selected_index];
            });
            break;
        case PTLS_EXTENSION_TYPE_COOKIE:
            if (properties == NULL || properties->server.cookie.key == NULL) {
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            ch->cookie.all = ptls_iovec_init(src, end - src);
            ptls_decode_block(src, end, 2, {
                ch->cookie.tbs.base = (void *)src;
                ptls_decode_open_block(src, end, 2, {
                    ptls_decode_open_block(src, end, 1, {
                        ch->cookie.ch1_hash = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    uint8_t sent_key_share;
                    if ((ret = ptls_decode8(&sent_key_share, &src, end)) != 0)
                        goto Exit;
                    switch (sent_key_share) {
                    case 0:
                        assert(!ch->cookie.sent_key_share);
                        break;
                    case 1:
                        ch->cookie.sent_key_share = 1;
                        break;
                    default:
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                });
                ch->cookie.tbs.len = src - ch->cookie.tbs.base;
                ptls_decode_block(src, end, 1, {
                    ch->cookie.signature = ptls_iovec_init(src, end - src);
                    src = end;
                });
            });
            break;
        case PTLS_EXTENSION_TYPE_PRE_SHARED_KEY: {
            size_t num_identities = 0;
            ptls_decode_open_block(src, end, 2, {
                do {
                    ptls_client_hello_psk_identity_t psk = {{NULL}};
                    ptls_decode_open_block(src, end, 2, {
                        if (end - src < 1) {
                            ret = PTLS_ALERT_DECODE_ERROR;
                            goto Exit;
                        }
                        psk.identity = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    if ((ret = ptls_decode32(&psk.obfuscated_ticket_age, &src, end)) != 0)
                        goto Exit;
                    if (ch->psk.identities.count < PTLS_ELEMENTSOF(ch->psk.identities.list))
                        ch->psk.identities.list[ch->psk.identities.count++] = psk;
                    ++num_identities;
                } while (src != end);
            });
            ch->psk.hash_end = src;
            ptls_decode_block(src, end, 2, {
                size_t num_binders = 0;
                do {
                    ptls_decode_open_block(src, end, 1, {
                        if (num_binders < ch->psk.identities.count)
                            ch->psk.identities.list[num_binders].binder = ptls_iovec_init(src, end - src);
                        src = end;
                    });
                    ++num_binders;
                } while (src != end);
                if (num_identities != num_binders) {
                    ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                    goto Exit;
                }
            });
            ch->psk.is_last_extension = 1;
        } break;
        case PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES:
            ptls_decode_block(src, end, 1, {
                do {
                    uint8_t mode;
                    if ((ret = ptls_decode8(&mode, &src, end)) != 0)
                        goto Exit;
                    if (mode < sizeof(ch->psk.ke_modes) * 8)
                        ch->psk.ke_modes |= 1u << mode;
                } while (src != end);
            });
            break;
        case PTLS_EXTENSION_TYPE_EARLY_DATA:
            ch->psk.early_data_indication = 1;
            break;
        case PTLS_EXTENSION_TYPE_STATUS_REQUEST:
            ch->status_request = 1;
            break;
        case PTLS_EXTENSION_TYPE_TICKET_REQUEST:
            if (end - src != 2) {
                ret = PTLS_ALERT_DECODE_ERROR;
                goto Exit;
            }
            ch->ticket_request.new_session_count = *src++;
            ch->ticket_request.resumption_count = *src++;
            break;
        case PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO:
            if ((ret = ptls_decode8(&ch->ech.type, &src, end)) != 0)
                goto Exit;
            switch (ch->ech.type) {
            case PTLS_ECH_CLIENT_HELLO_TYPE_OUTER:
                if ((ret = ptls_decode16(&ch->ech.cipher_suite.kdf, &src, end)) != 0 ||
                    (ret = ptls_decode16(&ch->ech.cipher_suite.aead, &src, end)) != 0)
                    goto Exit;
                if ((ret = ptls_decode8(&ch->ech.config_id, &src, end)) != 0)
                    goto Exit;
                ptls_decode_open_block(src, end, 2, {
                    ch->ech.enc = ptls_iovec_init(src, end - src);
                    src = end;
                });
                ptls_decode_open_block(src, end, 2, {
                    if (src == end) {
                        ret = PTLS_ALERT_DECODE_ERROR;
                        goto Exit;
                    }
                    ch->ech.payload = ptls_iovec_init(src, end - src);
                    src = end;
                });
                break;
            case PTLS_ECH_CLIENT_HELLO_TYPE_INNER:
                if (src != end) {
                    ret = PTLS_ALERT_DECODE_ERROR;
                    goto Exit;
                }
                ch->ech.payload = ptls_iovec_init("", 0); /* non-zero base indicates that the extension was received */
                break;
            default:
                ret = PTLS_ALERT_ILLEGAL_PARAMETER;
                goto Exit;
            }
            src = end;
            break;
        default:
            if (tls_cbarg != NULL && should_collect_unknown_extension(tls_cbarg, properties, exttype)) {
                if ((ret = collect_unknown_extension(tls_cbarg, exttype, src, end, ch->unknown_extensions)) != 0)
                    goto Exit;
            }
            break;
        }
        src = end;
    });

    ret = 0;
Exit:
    return ret;
}